

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *__file_00;
  int *piVar2;
  mode_t in_ECX;
  string local_48 [32];
  int local_28;
  uint local_24;
  int err;
  mode_t pmode;
  int oflag;
  present_mode present_local;
  writable_mode writable_local;
  create_mode create_local;
  file_handle *this_local;
  
  present_local = (present_mode)__file;
  pmode = in_ECX;
  oflag = __oflag;
  _writable_local = this;
  close(this,present_local);
  this->is_writable_ = oflag == 1;
  err = (this->is_writable_ & 1) * 2;
  if (present_local == allow_not_found) {
    err = err | 0xc0;
  }
  else if ((present_local != must_exist) && (present_local == 2)) {
    err = err | 0x40;
  }
  local_24 = 0x124;
  if ((this->is_writable_ & 1U) != 0) {
    local_24 = 0x1b6;
  }
  __file_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::open(__file_00,err,(ulong)local_24);
  this->file_ = iVar1;
  if (this->file_ == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if ((pmode != 0) || (iVar1 != 2)) {
      local_28 = iVar1;
      std::__cxx11::string::string(local_48,(string *)&this->path_);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar1,"Unable to open",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    this->file_ = -1;
  }
  return (int)this;
}

Assistant:

void file_handle::open (create_mode const create, writable_mode const writable,
                                present_mode const present) {
            this->close ();

            is_writable_ = writable == writable_mode::read_write;

            int oflag = is_writable_ ? O_RDWR : O_RDONLY;
            switch (create) {
            // Creates a new file, only if it does not already exist
            case create_mode::create_new:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT | O_EXCL;
                break;
            // Opens a file only if it already exists
            case create_mode::open_existing: break;
            // Opens an existing file if present, and creates a new file otherwise.
            case create_mode::open_always:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT;
                break;
            }

            // user, group, and others have read permission.
            // NOLINTNEXTLINE(hicpp-signed-bitwise)
            mode_t pmode = S_IRUSR | S_IRGRP | S_IROTH;
            if (is_writable_) {
                // user, group, and others have read and write permission.
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                pmode |= S_IWUSR | S_IWGRP | S_IWOTH;
            }

            file_ = ::open (path_.c_str (), oflag, pmode); // NOLINT
            if (file_ == -1) {
                int const err = errno;
                if (present == present_mode::allow_not_found && err == ENOENT) {
                    file_ = -1;
                } else {
                    raise_file_error (err, "Unable to open", path_);
                }
            }
        }